

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.cc
# Opt level: O1

void google::protobuf::internal::anon_unknown_22::UnknownFieldHandlerLite::Varint
               (MessageLite *msg,ParseTable *table,int tag,int value)

{
  ulong uVar1;
  bool bVar2;
  LogMessage *other;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  CodedOutputStream unknown_fields_stream;
  StringOutputStream unknown_fields_string;
  CodedOutputStream local_c8;
  StringOutputStream local_78;
  LogMessage local_68;
  
  if (table->unknown_field_set == true) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "third_party/protobuf-lite/generated_message_table_driven_lite.cc",0x45);
    other = LogMessage::operator<<(&local_68,"CHECK failed: !table.unknown_field_set: ");
    LogFinisher::operator=((LogFinisher *)&local_c8,other);
    LogMessage::~LogMessage(&local_68);
  }
  uVar1 = *(ulong *)((long)&msg->_vptr_MessageLite + table->arena_offset);
  if ((uVar1 & 1) == 0) {
    target = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
                       ((InternalMetadata *)((long)&msg->_vptr_MessageLite + table->arena_offset));
  }
  else {
    target = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((uVar1 & 0xfffffffffffffffe) + 8);
  }
  io::StringOutputStream::StringOutputStream(&local_78,target);
  io::CodedOutputStream::CodedOutputStream(&local_c8,&local_78.super_ZeroCopyOutputStream,false);
  if (local_c8.impl_.end_ <= local_c8.cur_) {
    local_c8.cur_ = io::EpsCopyOutputStream::EnsureSpaceFallback(&local_c8.impl_,local_c8.cur_);
  }
  if ((uint)tag < 0x80) {
    *local_c8.cur_ = (byte)tag;
    pbVar3 = local_c8.cur_ + 1;
  }
  else {
    *local_c8.cur_ = (byte)tag | 0x80;
    if ((uint)tag < 0x4000) {
      local_c8.cur_[1] = (byte)((uint)tag >> 7);
      pbVar3 = local_c8.cur_ + 2;
    }
    else {
      pbVar3 = local_c8.cur_ + 2;
      uVar5 = (uint)tag >> 7;
      do {
        pbVar4 = pbVar3;
        pbVar4[-1] = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar3 = pbVar4 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar2);
      *pbVar4 = (byte)uVar6;
    }
  }
  if (local_c8.impl_.end_ <= pbVar3) {
    local_c8.cur_ = pbVar3;
    pbVar3 = io::EpsCopyOutputStream::EnsureSpaceFallback(&local_c8.impl_,pbVar3);
  }
  if ((uint)value < 0x80) {
    *pbVar3 = (byte)value;
    local_c8.cur_ = pbVar3 + 1;
  }
  else {
    *pbVar3 = (byte)value | 0x80;
    if ((uint)value < 0x4000) {
      pbVar3[1] = (byte)((uint)value >> 7);
      local_c8.cur_ = pbVar3 + 2;
    }
    else {
      local_c8.cur_ = pbVar3 + 2;
      uVar5 = (uint)value >> 7;
      do {
        pbVar3 = local_c8.cur_;
        pbVar3[-1] = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        local_c8.cur_ = pbVar3 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar2);
      *pbVar3 = (byte)uVar6;
    }
  }
  io::CodedOutputStream::~CodedOutputStream(&local_c8);
  return;
}

Assistant:

static void Varint(MessageLite* msg, const ParseTable& table, int tag,
                     int value) {
    GOOGLE_DCHECK(!table.unknown_field_set);

    io::StringOutputStream unknown_fields_string(
        MutableUnknownFields(msg, table.arena_offset));
    io::CodedOutputStream unknown_fields_stream(&unknown_fields_string, false);
    unknown_fields_stream.WriteVarint32(tag);
    unknown_fields_stream.WriteVarint32(value);
  }